

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# window_generator.cc
# Opt level: O0

void webrtc::WindowGenerator::Hanning(int length,float *window)

{
  ostream *poVar1;
  float fVar2;
  int local_328;
  int i;
  FatalMessageVoidify local_1a5 [13];
  FatalMessage local_198;
  string *local_20;
  string *_result;
  float *window_local;
  int length_local;
  
  _result = (string *)window;
  window_local._4_4_ = length;
  local_20 = rtc::CheckGTImpl_abi_cxx11_(length,1,"length > 1");
  if (local_20 != (string *)0x0) {
    rtc::FatalMessage::FatalMessage
              (&local_198,
               "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
               ,0x29,local_20);
    rtc::FatalMessage::stream(&local_198);
    rtc::FatalMessage::~FatalMessage(&local_198);
  }
  if (_result != (string *)0x0) {
    local_20 = (string *)0x0;
    for (local_328 = 0; local_328 < window_local._4_4_; local_328 = local_328 + 1) {
      fVar2 = cosf(((float)local_328 * 6.2831855) / (float)(window_local._4_4_ + -1));
      *(float *)(_result + (long)local_328 * 4) = (1.0 - fVar2) * 0.5;
    }
    return;
  }
  rtc::FatalMessageVoidify::FatalMessageVoidify(local_1a5);
  rtc::FatalMessage::FatalMessage
            ((FatalMessage *)&i,
             "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/common_audio/window_generator.cc"
             ,0x2a);
  poVar1 = rtc::FatalMessage::stream((FatalMessage *)&i);
  poVar1 = std::operator<<(poVar1,"Check failed: window != nullptr");
  poVar1 = (ostream *)std::ostream::operator<<(poVar1,std::endl<char,std::char_traits<char>>);
  poVar1 = std::operator<<(poVar1,"# ");
  rtc::FatalMessageVoidify::operator&(local_1a5,poVar1);
  rtc::FatalMessage::~FatalMessage((FatalMessage *)&i);
}

Assistant:

void WindowGenerator::Hanning(int length, float* window) {
  RTC_CHECK_GT(length, 1);
  RTC_CHECK(window != nullptr);
  for (int i = 0; i < length; ++i) {
    window[i] = 0.5f * (1 - cosf(2 * static_cast<float>(M_PI) * i /
                                 (length - 1)));
  }
}